

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTim.c
# Opt level: O0

Gia_Man_t * Abc_NtkTestTimDeriveGia(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p;
  Tim_Man_t *pTVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Abc_Obj_t *pAVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  Vec_Flt_t *vInArrs;
  Vec_Flt_t *vOutReqs;
  void *pLib;
  int local_84;
  int nBoxFaninMax;
  int BoxUniqueId;
  int curPo;
  int curPi;
  int Entry;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Flt_t *vReqTimes;
  Vec_Flt_t *vArrTimes;
  Vec_Int_t *vGiaCoLits2;
  Vec_Int_t *vGiaCoLits;
  Tim_Man_t *pTim;
  Gia_Man_t *pHoles;
  Gia_Man_t *pGia;
  Gia_Man_t *pTemp;
  int fVerbose_local;
  Abc_Ntk_t *pNtk_local;
  
  local_84 = 0;
  iVar1 = Abc_NtkIsTopo(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsTopo(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x11a,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Abc_NtkFillTemp(pNtk);
  BoxUniqueId = Abc_NtkCiNum(pNtk);
  nBoxFaninMax = Abc_NtkCoNum(pNtk);
  for (Entry = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Entry < iVar1; Entry = Entry + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Entry);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      uVar2 = Abc_NodeIsWhiteBox(pAVar4);
      *(uint *)&pAVar4->field_0x14 = *(uint *)&pAVar4->field_0x14 & 0xffffffef | (uVar2 & 1) << 4;
      if ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) != 0) {
        iVar1 = Abc_ObjFaninNum(pAVar4);
        local_84 = Abc_MaxInt(local_84,iVar1);
        BoxUniqueId = BoxUniqueId + 1;
        iVar1 = Abc_ObjFaninNum(pAVar4);
        nBoxFaninMax = iVar1 + nBoxFaninMax;
        if (fVerbose != 0) {
          uVar2 = Abc_ObjFaninNum(pAVar4);
          printf("Selecting node %6d as white boxes with %d inputs and %d output.\n",
                 (ulong)(uint)Entry,(ulong)uVar2,1);
        }
      }
    }
  }
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pGVar5 = Gia_ManStart(iVar1);
  p = Gia_ManStart(1000);
  for (Entry = 0; Entry < BoxUniqueId; Entry = Entry + 1) {
    Gia_ManAppendCi(pGVar5);
  }
  for (Entry = 0; Entry < local_84; Entry = Entry + 1) {
    Gia_ManAppendCi(p);
  }
  Gia_ManHashAlloc(pGVar5);
  Gia_ManHashAlloc(p);
  pTVar6 = Tim_ManStart(BoxUniqueId,nBoxFaninMax);
  BoxUniqueId = 0;
  nBoxFaninMax = 0;
  for (Entry = 0; iVar1 = Abc_NtkCiNum(pNtk), Entry < iVar1; Entry = Entry + 1) {
    pAVar4 = Abc_NtkCi(pNtk,Entry);
    pGVar8 = Gia_ManCi(pGVar5,BoxUniqueId);
    iVar1 = Gia_ObjId(pGVar5,pGVar8);
    iVar1 = Abc_Var2Lit(iVar1,0);
    (pAVar4->field_6).iTemp = iVar1;
    BoxUniqueId = BoxUniqueId + 1;
  }
  p_00 = Vec_IntAlloc(1000);
  p_01 = Vec_IntAlloc(1000);
  for (Entry = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Entry < iVar1; Entry = Entry + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Entry);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar4), iVar1 != 0)) {
      if ((*(uint *)&pAVar4->field_0x14 >> 4 & 1) == 0) {
        iVar1 = Abc_NtkTestTimNodeStrash(pGVar5,pAVar4);
        (pAVar4->field_6).iTemp = iVar1;
      }
      else {
        iVar1 = Abc_ObjFaninNum(pAVar4);
        iVar3 = Abc_ObjFaninNum(pAVar4);
        Tim_ManCreateBox(pTVar6,nBoxFaninMax,iVar3,BoxUniqueId,1,iVar1,0);
        iVar1 = Abc_ObjFaninNum(pAVar4);
        nBoxFaninMax = iVar1 + nBoxFaninMax;
        for (curPi = 0; iVar1 = Abc_ObjFaninNum(pAVar4), curPi < iVar1; curPi = curPi + 1) {
          pAVar7 = Abc_ObjFanin(pAVar4,curPi);
          Vec_IntPush(p_00,(pAVar7->field_6).iTemp);
          pGVar8 = Gia_ManCi(p,curPi);
          iVar1 = Gia_ObjId(p,pGVar8);
          iVar1 = Abc_Var2Lit(iVar1,0);
          (pAVar7->field_6).iTemp = iVar1;
        }
        iVar1 = Abc_NtkTestTimNodeStrash(p,pAVar4);
        (pAVar4->field_6).iTemp = iVar1;
        Vec_IntPush(p_01,(pAVar4->field_6).iTemp);
        pGVar8 = Gia_ManCi(pGVar5,BoxUniqueId);
        iVar1 = Gia_ObjId(pGVar5,pGVar8);
        iVar1 = Abc_Var2Lit(iVar1,0);
        (pAVar4->field_6).iTemp = iVar1;
        BoxUniqueId = BoxUniqueId + 1;
      }
    }
  }
  Abc_NtkCleanMarkA(pNtk);
  for (Entry = 0; iVar1 = Abc_NtkCoNum(pNtk), Entry < iVar1; Entry = Entry + 1) {
    pAVar4 = Abc_NtkCo(pNtk,Entry);
    pAVar4 = Abc_ObjFanin0(pAVar4);
    Gia_ManAppendCo(pGVar5,(pAVar4->field_6).iTemp);
  }
  for (Entry = 0; iVar1 = Vec_IntSize(p_00), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p_00,Entry);
    Gia_ManAppendCo(pGVar5,iVar1);
  }
  Vec_IntFree(p_00);
  for (Entry = 0; iVar1 = Vec_IntSize(p_01), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(p_01,Entry);
    Gia_ManAppendCo(p,iVar1);
  }
  Vec_IntFree(p_01);
  iVar1 = Abc_NtkPoNum(pNtk);
  iVar3 = Gia_ManPiNum(pGVar5);
  if (BoxUniqueId != iVar3) {
    __assert_fail("curPi == Gia_ManPiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16d,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  iVar3 = Gia_ManPoNum(pGVar5);
  if (iVar1 + nBoxFaninMax != iVar3) {
    __assert_fail("curPo == Gia_ManPoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                  ,0x16e,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
  }
  Gia_ManHashStop(pGVar5);
  Gia_ManSetRegNum(pGVar5,0);
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,0);
  pGVar9 = Gia_ManCleanup(pGVar5);
  Gia_ManStop(pGVar5);
  pGVar5 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (pGVar9->pManTime == (void *)0x0) {
    pGVar9->pManTime = pTVar6;
    iVar1 = Abc_NtkPiNum(pNtk);
    vInArrs = Abc_NtkTestCreateArrivals(iVar1);
    iVar1 = Abc_NtkPoNum(pNtk);
    vOutReqs = Abc_NtkTestCreateRequired(iVar1);
    Tim_ManPrint((Tim_Man_t *)pGVar9->pManTime);
    pTVar6 = (Tim_Man_t *)pGVar9->pManTime;
    pLib = Abc_FrameReadLibBox();
    Tim_ManCreate(pTVar6,pLib,vInArrs,vOutReqs);
    Tim_ManPrint((Tim_Man_t *)pGVar9->pManTime);
    Vec_FltFree(vInArrs);
    Vec_FltFree(vOutReqs);
    Gia_AigerWrite(pGVar5,"holes00.aig",0,0);
    pGVar9->pAigExtra = pGVar5;
    return pGVar9;
  }
  __assert_fail("pGia->pManTime == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTim.c"
                ,0x17c,"Gia_Man_t *Abc_NtkTestTimDeriveGia(Abc_Ntk_t *, int)");
}

Assistant:

Gia_Man_t * Abc_NtkTestTimDeriveGia( Abc_Ntk_t * pNtk, int fVerbose )
{
    Gia_Man_t * pTemp;
    Gia_Man_t * pGia = NULL;
    Gia_Man_t * pHoles = NULL;
    Tim_Man_t * pTim = NULL;
    Vec_Int_t * vGiaCoLits, * vGiaCoLits2;
    Vec_Flt_t * vArrTimes, * vReqTimes;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Entry, curPi, curPo, BoxUniqueId;
    int nBoxFaninMax = 0;
    assert( Abc_NtkIsTopo(pNtk) );
    Abc_NtkFillTemp( pNtk );

    // create white boxes
    curPi = Abc_NtkCiNum(pNtk);
    curPo = Abc_NtkCoNum(pNtk);
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        pObj->fMarkA = Abc_NodeIsWhiteBox( pObj );
        if ( !pObj->fMarkA )
            continue;
        nBoxFaninMax  = Abc_MaxInt( nBoxFaninMax, Abc_ObjFaninNum(pObj) );
        curPi++;
        curPo += Abc_ObjFaninNum(pObj);
        if ( fVerbose )
            printf( "Selecting node %6d as white boxes with %d inputs and %d output.\n", i, Abc_ObjFaninNum(pObj), 1 );
    }

    // construct GIA
    pGia = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pHoles = Gia_ManStart( 1000 );
    for ( i = 0; i < curPi; i++ )
        Gia_ManAppendCi(pGia);
    for ( i = 0; i < nBoxFaninMax; i++ )
        Gia_ManAppendCi(pHoles);
    Gia_ManHashAlloc( pGia );
    Gia_ManHashAlloc( pHoles );

    // construct the timing manager
    pTim = Tim_ManStart( curPi, curPo );

    // assign primary inputs
    curPi = 0;
    curPo = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    // create internal nodes in a topologic order from white boxes
    vGiaCoLits = Vec_IntAlloc( 1000 );
    vGiaCoLits2 = Vec_IntAlloc( 1000 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !pObj->fMarkA ) // not a white box
        {
            pObj->iTemp = Abc_NtkTestTimNodeStrash( pGia, pObj );
            continue;
        }
        // create box
        BoxUniqueId = Abc_ObjFaninNum(pObj); // in this case, the node size is the ID of its delay table
        Tim_ManCreateBox( pTim, curPo, Abc_ObjFaninNum(pObj), curPi, 1, BoxUniqueId, 0 );
        curPo += Abc_ObjFaninNum(pObj);

        // handle box inputs
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            // save CO drivers for the AIG
            Vec_IntPush( vGiaCoLits, pFanin->iTemp );
            // load CI nodes for the Holes
            pFanin->iTemp = Abc_Var2Lit( Gia_ObjId(pHoles, Gia_ManCi(pHoles, k)), 0 );
        }

        // handle logic of the box
        pObj->iTemp = Abc_NtkTestTimNodeStrash( pHoles, pObj );

        // handle box outputs
        // save CO drivers for the Holes
        Vec_IntPush( vGiaCoLits2, pObj->iTemp );
//        Gia_ManAppendCo( pHoles, pObj->iTemp );
        // load CO drivers for the AIG
        pObj->iTemp = Abc_Var2Lit( Gia_ObjId(pGia, Gia_ManCi(pGia, curPi++)), 0 );
    }
    Abc_NtkCleanMarkA( pNtk );
    // create COs of the AIG
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gia_ManAppendCo( pGia, Abc_ObjFanin0(pObj)->iTemp );
    Vec_IntForEachEntry( vGiaCoLits, Entry, i )
        Gia_ManAppendCo( pGia, Entry );
    Vec_IntFree( vGiaCoLits );
    // second AIG
    Vec_IntForEachEntry( vGiaCoLits2, Entry, i )
        Gia_ManAppendCo( pHoles, Entry );
    Vec_IntFree( vGiaCoLits2 );
    // check parameters
    curPo += Abc_NtkPoNum( pNtk );
    assert( curPi == Gia_ManPiNum(pGia) );
    assert( curPo == Gia_ManPoNum(pGia) );
    // finalize GIA
    Gia_ManHashStop( pGia );
    Gia_ManSetRegNum( pGia, 0 );
    Gia_ManHashStop( pHoles );
    Gia_ManSetRegNum( pHoles, 0 );

    // clean up GIA
    pGia = Gia_ManCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    pHoles = Gia_ManCleanup( pTemp = pHoles );
    Gia_ManStop( pTemp );

    // attach the timing manager
    assert( pGia->pManTime == NULL );
    pGia->pManTime = pTim;

    // derive hierarchy manager from box info and input/output arrival/required info
    vArrTimes = Abc_NtkTestCreateArrivals( Abc_NtkPiNum(pNtk) );
    vReqTimes = Abc_NtkTestCreateRequired( Abc_NtkPoNum(pNtk) );

    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );
    Tim_ManCreate( (Tim_Man_t *)pGia->pManTime, Abc_FrameReadLibBox(), vArrTimes, vReqTimes );
    Tim_ManPrint( (Tim_Man_t *)pGia->pManTime );

    Vec_FltFree( vArrTimes );
    Vec_FltFree( vReqTimes );

Gia_AigerWrite( pHoles, "holes00.aig", 0, 0 );

    // return 
    pGia->pAigExtra = pHoles;
    return pGia;
}